

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int ossl_bio_cf_create(BIO *bio)

{
  BIO_set_shutdown(bio,1);
  BIO_set_init(bio,1);
  BIO_set_data(bio,0);
  return 1;
}

Assistant:

static int ossl_bio_cf_create(BIO *bio)
{
  BIO_set_shutdown(bio, 1);
  BIO_set_init(bio, 1);
#if OPENSSL_VERSION_NUMBER < 0x10100000L
  bio->num = -1;
#endif
  BIO_set_data(bio, NULL);
  return 1;
}